

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3-tiny.cpp
# Opt level: O1

void __thiscall
yolo_layer::yolo_layer
          (yolo_layer *this,int classes,vector<int,_std::allocator<int>_> *mask,
          vector<float,_std::allocator<float>_> *anchors,ggml_tensor *prev_layer)

{
  pointer pfVar1;
  int64_t iVar2;
  ulong uVar3;
  undefined8 uVar4;
  
  this->classes = classes;
  std::vector<int,_std::allocator<int>_>::vector(&this->mask,mask);
  std::vector<float,_std::allocator<float>_>::vector(&this->anchors,anchors);
  (this->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = prev_layer->ne[1];
  this->w = (int)prev_layer->ne[0];
  this->h = (int)iVar2;
  uVar3 = ggml_nbytes(prev_layer);
  std::vector<float,_std::allocator<float>_>::resize(&this->predictions,uVar3 >> 2);
  pfVar1 = (this->predictions).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = ggml_nbytes(prev_layer);
  ggml_backend_tensor_get(prev_layer,pfVar1,0,uVar4);
  return;
}

Assistant:

yolo_layer(int classes, const std::vector<int> & mask, const std::vector<float> & anchors, struct ggml_tensor * prev_layer)
        : classes(classes), mask(mask), anchors(anchors)
    {
        w = prev_layer->ne[0];
        h = prev_layer->ne[1];
        predictions.resize(ggml_nbytes(prev_layer)/sizeof(float));
        ggml_backend_tensor_get(prev_layer, predictions.data(), 0, ggml_nbytes(prev_layer));
    }